

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

void __thiscall
rr::TriangleRasterizer::rasterizeSingleSample
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float *pfVar1;
  FragmentPacket *pFVar2;
  int *piVar3;
  tcu *this_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  FragmentPacket *pFVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int i;
  long lVar26;
  Vec4 edgeSum;
  Vector<long,_4> e20;
  Vector<long,_4> e12;
  Vector<long,_4> e01;
  Vec4 bSum;
  Vec4 e12f;
  deInt64 sy [4];
  Vec4 z1;
  Vec4 z0;
  Vec4 e01f;
  Vec4 e20f;
  Vector<float,_4> local_1b8;
  int *local_1a8;
  FragmentPacket *local_1a0;
  ulong local_198;
  ulong local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  Vector<long,_4> local_178;
  Vector<long,_4> local_158;
  Vector<long,_4> local_138;
  Vector<float,_4> local_118;
  Vector<long,_4> local_108;
  long local_e8;
  long local_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  Vector<long,_4> local_88;
  uint local_68;
  int iStack_64;
  uint uStack_60;
  int iStack_5c;
  tcu local_50 [16];
  tcu local_40 [16];
  
  local_b8 = (this->m_v2).m_data[2];
  local_c8 = (this->m_v0).m_data[2] - local_b8;
  local_d8 = (this->m_v1).m_data[2] - local_b8;
  iVar25 = 0;
  local_1a8 = numPacketsRasterized;
  local_1a0 = fragmentPackets;
  fStack_d4 = local_d8;
  fStack_d0 = local_d8;
  fStack_cc = local_d8;
  fStack_c4 = local_c8;
  fStack_c0 = local_c8;
  fStack_bc = local_c8;
  fStack_b4 = local_b8;
  fStack_b0 = local_b8;
  fStack_ac = local_b8;
  while( true ) {
    uVar4 = (this->m_curPos).m_data[1];
    local_190 = (ulong)uVar4;
    if (((this->m_bboxMax).m_data[1] < (int)uVar4) || (maxFragmentPackets <= iVar25)) break;
    uVar5 = (this->m_curPos).m_data[0];
    local_198 = (ulong)uVar5;
    local_108.m_data[2] = (long)(int)(uVar4 << 8 | 0x80);
    local_e8 = (long)(int)((uVar4 + 1) * 0x100 | 0x80);
    iVar24 = uVar5 + 1;
    local_88.m_data[2]._0_4_ = uVar5 << 8 | 0x80;
    local_88.m_data[3]._0_4_ = iVar24 * 0x100 | 0x80;
    local_88.m_data[2]._4_4_ = -(uint)((int)(uint)local_88.m_data[2] < 0);
    local_88.m_data[3]._4_4_ = -(uint)((int)(uint)local_88.m_data[3] < 0);
    iVar18 = (this->m_viewport).m_data[3];
    iVar17 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
    iVar6 = (this->m_viewport).m_data[1];
    local_108.m_data[3] = local_108.m_data[2];
    local_e0 = local_e8;
    local_68 = (uint)local_88.m_data[2];
    iStack_64 = local_88.m_data[2]._4_4_;
    uStack_60 = (uint)local_88.m_data[3];
    iStack_5c = local_88.m_data[3]._4_4_;
    tcu::Vector<long,_4>::Vector(&local_138);
    tcu::Vector<long,_4>::Vector(&local_158);
    tcu::Vector<long,_4>::Vector(&local_178);
    lVar20 = (this->m_edge01).a;
    lVar22 = (this->m_edge01).b;
    lVar7 = (this->m_edge01).c;
    lVar8 = (this->m_edge12).a;
    lVar9 = (this->m_edge12).b;
    lVar10 = (this->m_edge12).c;
    lVar11 = (this->m_edge20).a;
    lVar12 = (this->m_edge20).b;
    lVar13 = (this->m_edge20).c;
    for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
      lVar14 = local_88.m_data[lVar26 + 2];
      lVar15 = local_108.m_data[lVar26 + 2];
      local_138.m_data[lVar26] = lVar22 * lVar15 + lVar20 * lVar14 + lVar7;
      local_158.m_data[lVar26] = lVar9 * lVar15 + lVar8 * lVar14 + lVar10;
      local_178.m_data[lVar26] = lVar15 * lVar12 + lVar14 * lVar11 + lVar13;
    }
    uVar19 = (ulong)(this->m_edge01).inclusive;
    lVar20 = -uVar19;
    if (local_138.m_data[0] == lVar20 ||
        SBORROW8(local_138.m_data[0],lVar20) != (long)(local_138.m_data[0] + uVar19) < 0) {
      uVar21 = 0;
    }
    else {
      uVar21 = (ulong)(this->m_edge12).inclusive;
      lVar22 = -uVar21;
      if (local_158.m_data[0] == lVar22 ||
          SBORROW8(local_158.m_data[0],lVar22) != (long)(local_158.m_data[0] + uVar21) < 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(this->m_edge20).inclusive;
        lVar22 = -uVar21;
        uVar21 = (ulong)(local_178.m_data[0] != lVar22 &&
                        SBORROW8(local_178.m_data[0],lVar22) ==
                        (long)(local_178.m_data[0] + uVar21) < 0);
      }
    }
    if (((iVar24 != iVar17) &&
        (local_138.m_data[1] != lVar20 &&
         SBORROW8(local_138.m_data[1],lVar20) == (long)(local_138.m_data[1] + uVar19) < 0)) &&
       (uVar23 = (ulong)(this->m_edge12).inclusive, lVar22 = -uVar23,
       local_158.m_data[1] != lVar22 &&
       SBORROW8(local_158.m_data[1],lVar22) == (long)(local_158.m_data[1] + uVar23) < 0)) {
      uVar23 = (ulong)(this->m_edge20).inclusive;
      lVar22 = -uVar23;
      if (local_178.m_data[1] != lVar22 &&
          SBORROW8(local_178.m_data[1],lVar22) == (long)(local_178.m_data[1] + uVar23) < 0) {
        uVar21 = uVar21 + 4;
      }
    }
    if (uVar4 + 1 != iVar18 + iVar6) {
      if ((local_138.m_data[2] != lVar20 &&
           SBORROW8(local_138.m_data[2],lVar20) == (long)(local_138.m_data[2] + uVar19) < 0) &&
         (uVar23 = (ulong)(this->m_edge12).inclusive, lVar22 = -uVar23,
         local_158.m_data[2] != lVar22 &&
         SBORROW8(local_158.m_data[2],lVar22) == (long)(local_158.m_data[2] + uVar23) < 0)) {
        uVar23 = (ulong)(this->m_edge20).inclusive;
        lVar22 = -uVar23;
        if (local_178.m_data[2] != lVar22 &&
            SBORROW8(local_178.m_data[2],lVar22) == (long)(local_178.m_data[2] + uVar23) < 0) {
          uVar21 = uVar21 | 2;
        }
      }
      if (((iVar24 != iVar17) &&
          (local_138.m_data[3] != lVar20 &&
           SBORROW8(local_138.m_data[3],lVar20) == (long)(local_138.m_data[3] + uVar19) < 0)) &&
         (uVar19 = (ulong)(this->m_edge12).inclusive, lVar20 = -uVar19,
         local_158.m_data[3] != lVar20 &&
         SBORROW8(local_158.m_data[3],lVar20) == (long)(local_158.m_data[3] + uVar19) < 0)) {
        uVar19 = (ulong)(this->m_edge20).inclusive;
        lVar20 = -uVar19;
        uVar21 = uVar21 + (ulong)(local_178.m_data[3] != lVar20 &&
                                 SBORROW8(local_178.m_data[3],lVar20) ==
                                 (long)(local_178.m_data[3] + uVar19) < 0) * 8;
      }
    }
    iVar18 = (this->m_curPos).m_data[0] + 2;
    (this->m_curPos).m_data[0] = iVar18;
    if ((this->m_bboxMax).m_data[0] < iVar18) {
      piVar3 = (this->m_curPos).m_data + 1;
      *piVar3 = *piVar3 + 2;
      (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
    }
    if (uVar21 != 0) {
      tcu::Vector<long,_4>::cast<float>(&local_88);
      tcu::Vector<long,_4>::cast<float>(&local_108);
      this_00 = local_50 + 0x10;
      tcu::Vector<long,_4>::cast<float>((Vector<long,_4> *)this_00);
      if (depthValues != (float *)0x0) {
        tcu::operator+((tcu *)&local_98,(Vector<float,_4> *)&local_88,(Vector<float,_4> *)&local_108
                      );
        tcu::operator+((tcu *)&local_1b8,(Vector<float,_4> *)&local_98,(Vector<float,_4> *)this_00);
        tcu::operator/((tcu *)&local_98,(Vector<float,_4> *)&local_108,&local_1b8);
        tcu::operator/((tcu *)&local_a8,(Vector<float,_4> *)this_00,&local_1b8);
        pfVar1 = depthValues + iVar25 * 4;
        *pfVar1 = local_98 * local_c8 + local_a8 * local_d8 + local_b8;
        pfVar1[1] = fStack_94 * fStack_c4 + fStack_a4 * fStack_d4 + fStack_b4;
        pfVar1[2] = fStack_90 * fStack_c0 + fStack_a0 * fStack_d0 + fStack_b0;
        pfVar1[3] = fStack_8c * fStack_bc + fStack_9c * fStack_cc + fStack_ac;
      }
      tcu::operator*((tcu *)&local_1b8,(this->m_v0).m_data[3],(Vector<float,_4> *)&local_108);
      tcu::operator*((tcu *)&local_98,(this->m_v1).m_data[3],(Vector<float,_4> *)this_00);
      tcu::operator*((tcu *)&local_a8,(this->m_v2).m_data[3],(Vector<float,_4> *)&local_88);
      tcu::operator+((tcu *)&local_188,&local_1b8,(Vector<float,_4> *)&local_98);
      tcu::operator+((tcu *)&local_118,(Vector<float,_4> *)&local_188,(Vector<float,_4> *)&local_a8)
      ;
      pFVar16 = local_1a0;
      pFVar2 = local_1a0 + iVar25;
      *(ulong *)(pFVar2->position).m_data = (local_190 << 0x20) + local_198;
      pFVar2->coverage = uVar21;
      tcu::operator/((tcu *)&local_188,&local_1b8,&local_118);
      *(undefined8 *)pFVar2->barycentric[0].m_data = local_188;
      *(undefined8 *)(pFVar2->barycentric[0].m_data + 2) = uStack_180;
      tcu::operator/((tcu *)&local_188,(Vector<float,_4> *)&local_98,&local_118);
      *(undefined8 *)pFVar16[iVar25].barycentric[1].m_data = local_188;
      *(undefined8 *)(pFVar16[iVar25].barycentric[1].m_data + 2) = uStack_180;
      tcu::operator-(local_50,1.0,pFVar2->barycentric);
      tcu::operator-((tcu *)&local_188,(Vector<float,_4> *)local_50,pFVar16[iVar25].barycentric + 1)
      ;
      *(undefined8 *)pFVar16[iVar25].barycentric[2].m_data = local_188;
      *(undefined8 *)(pFVar16[iVar25].barycentric[2].m_data + 2) = uStack_180;
      iVar25 = iVar25 + 1;
    }
  }
  *local_1a8 = iVar25;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeSingleSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation; given barycentrics A, B, C = (1 - A - B)
	// we can reformulate the usual z = z0*A + z1*B + z2*C into more
	// stable equation z = A*(z0 - z2) + B*(z1 - z2) + z2.
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0)	+ halfPixel;
		const deInt64	sx1		= toSubpixelCoord(x0+1)	+ halfPixel;
		const deInt64	sy0		= toSubpixelCoord(y0)	+ halfPixel;
		const deInt64	sy1		= toSubpixelCoord(y0+1)	+ halfPixel;

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01;
		tcu::Vector<deInt64, 4>	e12;
		tcu::Vector<deInt64, 4>	e20;

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values
		for (int i = 0; i < 4; i++)
		{
			e01[i] = evaluateEdge(m_edge01, sx[i], sy[i]);
			e12[i] = evaluateEdge(m_edge12, sx[i], sy[i]);
			e20[i] = evaluateEdge(m_edge20, sx[i], sy[i]);
		}

		// Compute coverage mask
		coverage = setCoverageValue(coverage, 1, 0, 0, 0,						isInsideCCW(m_edge01, e01[0]) && isInsideCCW(m_edge12, e12[0]) && isInsideCCW(m_edge20, e20[0]));
		coverage = setCoverageValue(coverage, 1, 1, 0, 0, !outX1 &&				isInsideCCW(m_edge01, e01[1]) && isInsideCCW(m_edge12, e12[1]) && isInsideCCW(m_edge20, e20[1]));
		coverage = setCoverageValue(coverage, 1, 0, 1, 0, !outY1 &&				isInsideCCW(m_edge01, e01[2]) && isInsideCCW(m_edge12, e12[2]) && isInsideCCW(m_edge20, e20[2]));
		coverage = setCoverageValue(coverage, 1, 1, 1, 0, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[3]) && isInsideCCW(m_edge12, e12[3]) && isInsideCCW(m_edge20, e20[3]));

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Floating-point edge values for barycentrics etc.
		const tcu::Vec4		e01f	= e01.asFloat();
		const tcu::Vec4		e12f	= e12.asFloat();
		const tcu::Vec4		e20f	= e20.asFloat();

		// Compute depth values.
		if (depthValues)
		{
			const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
			const tcu::Vec4		z0		= e12f / edgeSum;
			const tcu::Vec4		z1		= e20f / edgeSum;

			depthValues[packetNdx*4+0] = z0[0]*za + z1[0]*zb + zc;
			depthValues[packetNdx*4+1] = z0[1]*za + z1[1]*zb + zc;
			depthValues[packetNdx*4+2] = z0[2]*za + z1[2]*zb + zc;
			depthValues[packetNdx*4+3] = z0[3]*za + z1[3]*zb + zc;
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}